

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bicubic_compute_blob.h
# Opt level: O2

void ncnn::gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar6;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined4 uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  float *pfVar12;
  undefined8 *puVar13;
  int iVar14;
  float *pfVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  undefined4 in_R10D;
  undefined4 uVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  undefined8 *puVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  int iVar29;
  float fVar30;
  int iVar31;
  int iVar32;
  
  iVar19 = grid->h * grid->w;
  puVar24 = (undefined8 *)offset_value->data;
  if (permute_fusion == 0) {
    pvVar3 = grid->data;
    sVar4 = grid->cstep;
    sVar5 = grid->elemsize;
    for (lVar23 = 0; lVar23 < grid->c; lVar23 = lVar23 + 1) {
      puVar13 = (undefined8 *)(sVar4 * sVar5 * lVar23 + (long)pvVar3);
      for (iVar16 = 0; iVar16 < iVar19; iVar16 = iVar16 + 2) {
        uVar2 = src->w;
        uVar7 = src->h;
        fVar26 = (float)(uVar2 + -1) * ((float)*puVar13 * 0.5 + 0.5);
        fVar30 = (float)(uVar7 + -1) * ((float)((ulong)*puVar13 >> 0x20) * 0.5 + 0.5);
        fVar27 = floorf(fVar26);
        fVar28 = floorf(fVar30);
        iVar29 = (int)fVar27;
        *puVar24 = CONCAT44(fVar30 - (float)(int)fVar28,fVar26 - (float)iVar29);
        iVar21 = (int)(float)(iVar29 + 2);
        iVar31 = (int)(float)(iVar29 + 1);
        iVar32 = (int)(float)(iVar29 + -1);
        auVar10._4_4_ = -(uint)(-1 < iVar31);
        auVar10._0_4_ = -(uint)(-1 < iVar31);
        auVar10._8_4_ = -(uint)(-1 < iVar32);
        auVar10._12_4_ = -(uint)(-1 < iVar32);
        uVar20 = movmskpd(in_R10D,auVar10);
        in_R10D = CONCAT31((int3)((uint)uVar20 >> 8),iVar21 < (int)uVar2 && -1 < iVar21);
        iVar22 = (int)fVar28 + -1;
        for (lVar18 = 8; (int)lVar18 != 0x48; lVar18 = lVar18 + 0x10) {
          iVar11 = (int)(float)iVar22;
          iVar17 = src->w * iVar11;
          bVar25 = iVar11 < 0;
          bVar8 = src->h <= iVar11;
          iVar14 = -1;
          iVar11 = (iVar32 + iVar17) * src->elempack;
          if (bVar25 || bVar8) {
            iVar11 = iVar14;
          }
          if (((byte)uVar20 >> 1 & iVar32 < (int)uVar2) == 0) {
            iVar11 = -1;
          }
          *(int *)((long)puVar24 + lVar18) = iVar11;
          iVar11 = (iVar29 + iVar17) * src->elempack;
          if (bVar25 || bVar8) {
            iVar11 = iVar14;
          }
          if ((int)uVar2 <= iVar29 || iVar29 < 0) {
            iVar11 = -1;
          }
          *(int *)((long)puVar24 + lVar18 + 4) = iVar11;
          iVar11 = (iVar31 + iVar17) * src->elempack;
          if (bVar25 || bVar8) {
            iVar11 = iVar14;
          }
          if ((iVar31 < (int)uVar2 & (byte)uVar20) == 0) {
            iVar11 = -1;
          }
          *(int *)((long)puVar24 + lVar18 + 8) = iVar11;
          iVar11 = (iVar17 + iVar21) * src->elempack;
          if (bVar25 || bVar8) {
            iVar11 = iVar14;
          }
          if (iVar21 >= (int)uVar2 || -1 >= iVar21) {
            iVar11 = -1;
          }
          *(int *)((long)puVar24 + lVar18 + 0xc) = iVar11;
          iVar22 = iVar22 + 1;
        }
        puVar13 = puVar13 + 1;
        puVar24 = puVar24 + 9;
      }
    }
  }
  else {
    pfVar12 = (float *)grid->data;
    pfVar15 = (float *)(grid->elemsize * grid->cstep + (long)pfVar12);
    iVar16 = 0;
    if (iVar19 < 1) {
      iVar19 = 0;
    }
    for (; iVar16 != iVar19; iVar16 = iVar16 + 1) {
      uVar1 = src->w;
      uVar6 = src->h;
      fVar26 = (float)(uVar1 + -1) * (*pfVar12 * 0.5 + 0.5);
      fVar30 = (float)(uVar6 + -1) * (*pfVar15 * 0.5 + 0.5);
      fVar27 = floorf(fVar26);
      fVar28 = floorf(fVar30);
      iVar29 = (int)fVar27;
      *puVar24 = CONCAT44(fVar30 - (float)(int)fVar28,fVar26 - (float)iVar29);
      iVar21 = (int)(float)(iVar29 + 2);
      iVar31 = (int)(float)(iVar29 + 1);
      iVar32 = (int)(float)(iVar29 + -1);
      auVar9._4_4_ = -(uint)(-1 < iVar31);
      auVar9._0_4_ = -(uint)(-1 < iVar31);
      auVar9._8_4_ = -(uint)(-1 < iVar32);
      auVar9._12_4_ = -(uint)(-1 < iVar32);
      uVar20 = movmskpd(in_R10D,auVar9);
      in_R10D = CONCAT31((int3)((uint)uVar20 >> 8),iVar21 < (int)uVar1 && -1 < iVar21);
      iVar22 = (int)fVar28 + -1;
      for (lVar23 = 8; (int)lVar23 != 0x48; lVar23 = lVar23 + 0x10) {
        iVar11 = (int)(float)iVar22;
        iVar17 = src->w * iVar11;
        bVar25 = iVar11 < 0;
        bVar8 = src->h <= iVar11;
        iVar14 = -1;
        iVar11 = (iVar32 + iVar17) * src->elempack;
        if (bVar25 || bVar8) {
          iVar11 = iVar14;
        }
        if (((byte)uVar20 >> 1 & iVar32 < (int)uVar1) == 0) {
          iVar11 = -1;
        }
        *(int *)((long)puVar24 + lVar23) = iVar11;
        iVar11 = (iVar29 + iVar17) * src->elempack;
        if (bVar25 || bVar8) {
          iVar11 = iVar14;
        }
        if ((int)uVar1 <= iVar29 || iVar29 < 0) {
          iVar11 = -1;
        }
        *(int *)((long)puVar24 + lVar23 + 4) = iVar11;
        iVar11 = (iVar31 + iVar17) * src->elempack;
        if (bVar25 || bVar8) {
          iVar11 = iVar14;
        }
        if ((iVar31 < (int)uVar1 & (byte)uVar20) == 0) {
          iVar11 = -1;
        }
        *(int *)((long)puVar24 + lVar23 + 8) = iVar11;
        iVar11 = (iVar17 + iVar21) * src->elempack;
        if (bVar25 || bVar8) {
          iVar11 = iVar14;
        }
        if (iVar21 >= (int)uVar1 || -1 >= iVar21) {
          iVar11 = -1;
        }
        *(int *)((long)puVar24 + lVar23 + 0xc) = iVar11;
        iVar22 = iVar22 + 1;
      }
      pfVar12 = pfVar12 + 1;
      pfVar15 = pfVar15 + 1;
      puVar24 = puVar24 + 9;
    }
  }
  return;
}

Assistant:

void gridsample_2d_bicubic_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h;

    float* offset_value_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 15 < grid_size; x += 16)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);

                transpose2x8_ps(gx, gy);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gy = unormalize(_mm256_set1_ps(src.h), gy);

                __m256 gx_floor = _mm256_floor_ps(gx);
                __m256 gy_floor = _mm256_floor_ps(gy);

                __m256 tx = _mm256_sub_ps(gx, gx_floor);
                __m256 ty = _mm256_sub_ps(gy, gy_floor);

                __m256 gx0 = _mm256_add_ps(gx_floor, _mm256_set1_ps(-1));
                __m256 gx1 = gx_floor;
                __m256 gx2 = _mm256_add_ps(gx_floor, _mm256_set1_ps(1));
                __m256 gx3 = _mm256_add_ps(gx2, _mm256_set1_ps(1));

                gx0 = get_coord(_mm256_set1_ps(src.w), gx0);
                gx1 = get_coord(_mm256_set1_ps(src.w), gx1);
                gx2 = get_coord(_mm256_set1_ps(src.w), gx2);
                gx3 = get_coord(_mm256_set1_ps(src.w), gx3);

                __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(gx0, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx0, _CMP_GT_OS));
                __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(gx1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx1, _CMP_GT_OS));
                __m256 x2_in_range = _mm256_and_ps(_mm256_cmp_ps(gx2, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx2, _CMP_GT_OS));
                __m256 x3_in_range = _mm256_and_ps(_mm256_cmp_ps(gx3, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx3, _CMP_GT_OS));
                __m256 v0_offset_f[4], v1_offset_f[4], v2_offset_f[4], v3_offset_f[4];
                for (int i = 0; i < 4; i++)
                {
                    gy = _mm256_add_ps(gy_floor, _mm256_set1_ps(-1.0f + i));
                    gy = get_coord(_mm256_set1_ps(src.h), gy);

                    __m256 y_in_range = _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS));

                    __m256 gy_offset = _mm256_mul_ps(gy, _mm256_set1_ps(src.w));

                    v0_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx0), _mm256_set1_ps(src.elempack));
                    v1_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx1), _mm256_set1_ps(src.elempack));
                    v2_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx2), _mm256_set1_ps(src.elempack));
                    v3_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx3), _mm256_set1_ps(src.elempack));

                    v0_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v0_offset_f[i], _mm256_and_ps(x0_in_range, y_in_range));
                    v1_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v1_offset_f[i], _mm256_and_ps(x1_in_range, y_in_range));
                    v2_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v2_offset_f[i], _mm256_and_ps(x2_in_range, y_in_range));
                    v3_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v3_offset_f[i], _mm256_and_ps(x3_in_range, y_in_range));

                    v0_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v0_offset_f[i]));
                    v1_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v1_offset_f[i]));
                    v2_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v2_offset_f[i]));
                    v3_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v3_offset_f[i]));
                }

                transpose8x18_ps(tx, ty, v0_offset_f[0], v1_offset_f[0], v2_offset_f[0], v3_offset_f[0], v0_offset_f[1], v1_offset_f[1], v2_offset_f[1], v3_offset_f[1], v0_offset_f[2], v1_offset_f[2], v2_offset_f[2], v3_offset_f[2], v0_offset_f[3], v1_offset_f[3], v2_offset_f[3], v3_offset_f[3]);

                _mm256_storeu_ps(offset_value_ptr, tx);
                _mm256_storeu_ps(offset_value_ptr + 8, ty);
                offset_value_ptr += 16;
                for (int i = 0; i < 4; i++)
                {
                    _mm256_storeu_ps(offset_value_ptr, v0_offset_f[i]);
                    _mm256_storeu_ps(offset_value_ptr + 8, v1_offset_f[i]);
                    _mm256_storeu_ps(offset_value_ptr + 16, v2_offset_f[i]);
                    _mm256_storeu_ps(offset_value_ptr + 24, v3_offset_f[i]);
                    offset_value_ptr += 32;
                }
                gridptr += 16;
            }

#endif // __AVX__

            for (; x < grid_size; x += 2)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);

                sample_x = unormalize(src.w, sample_x);
                sample_y = unormalize(src.h, sample_y);

                int x1 = floorf(sample_x);
                int y1 = floorf(sample_y);
                int x0 = x1 - 1;
                int x2 = x1 + 1;
                int x3 = x1 + 2;

                offset_value_ptr[0] = sample_x - static_cast<float>(x1);
                offset_value_ptr[1] = sample_y - static_cast<float>(y1);

                x1 = get_coord(src.w, x1);
                x0 = get_coord(src.w, x0);
                x2 = get_coord(src.w, x2);
                x3 = get_coord(src.w, x3);

                bool x1_in_range = (x1 > -1) & (x1 < src.w);
                bool x0_in_range = (x0 > -1) & (x0 < src.w);
                bool x2_in_range = (x2 > -1) & (x2 < src.w);
                bool x3_in_range = (x3 > -1) & (x3 < src.w);

                int* offset_ptr = (int*)offset_value_ptr + 2;

                for (int i = 0; i < 4; i++)
                {
                    int gy = y1 + i - 1;
                    gy = get_coord(src.h, gy);
                    int offset_y = gy * src.w;

                    bool y_in_range = (gy > -1) & (gy < src.h);

                    bool v0_in_bound = (x0_in_range & y_in_range);
                    bool v1_in_bound = (x1_in_range & y_in_range);
                    bool v2_in_bound = (x2_in_range & y_in_range);
                    bool v3_in_bound = (x3_in_range & y_in_range);

                    offset_ptr[0] = v0_in_bound ? (offset_y + x0) * src.elempack : -1.0;
                    offset_ptr[1] = v1_in_bound ? (offset_y + x1) * src.elempack : -1.0;
                    offset_ptr[2] = v2_in_bound ? (offset_y + x2) * src.elempack : -1.0;
                    offset_ptr[3] = v3_in_bound ? (offset_y + x3) * src.elempack : -1.0;

                    offset_ptr += 4;
                }

                gridptr += 2;
                offset_value_ptr += 18;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gy = unormalize(_mm256_set1_ps(src.h), gy);

            __m256 gx_floor = _mm256_floor_ps(gx);
            __m256 gy_floor = _mm256_floor_ps(gy);

            __m256 tx = _mm256_sub_ps(gx, gx_floor);
            __m256 ty = _mm256_sub_ps(gy, gy_floor);

            __m256 gx0 = _mm256_add_ps(gx_floor, _mm256_set1_ps(-1));
            __m256 gx1 = gx_floor;
            __m256 gx2 = _mm256_add_ps(gx_floor, _mm256_set1_ps(1));
            __m256 gx3 = _mm256_add_ps(gx2, _mm256_set1_ps(1));

            gx0 = get_coord(_mm256_set1_ps(src.w), gx0);
            gx1 = get_coord(_mm256_set1_ps(src.w), gx1);
            gx2 = get_coord(_mm256_set1_ps(src.w), gx2);
            gx3 = get_coord(_mm256_set1_ps(src.w), gx3);

            __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(gx0, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx0, _CMP_GT_OS));
            __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(gx1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx1, _CMP_GT_OS));
            __m256 x2_in_range = _mm256_and_ps(_mm256_cmp_ps(gx2, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx2, _CMP_GT_OS));
            __m256 x3_in_range = _mm256_and_ps(_mm256_cmp_ps(gx3, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx3, _CMP_GT_OS));

            __m256 v0_offset_f[4], v1_offset_f[4], v2_offset_f[4], v3_offset_f[4];
            for (int i = 0; i < 4; i++)
            {
                gy = _mm256_add_ps(gy_floor, _mm256_set1_ps(-1.0f + i));
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                __m256 y_in_range = _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS));

                __m256 gy_offset = _mm256_mul_ps(gy, _mm256_set1_ps(src.w));

                v0_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx0), _mm256_set1_ps(src.elempack));
                v1_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx1), _mm256_set1_ps(src.elempack));
                v2_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx2), _mm256_set1_ps(src.elempack));
                v3_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx3), _mm256_set1_ps(src.elempack));

                v0_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v0_offset_f[i], _mm256_and_ps(x0_in_range, y_in_range));
                v1_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v1_offset_f[i], _mm256_and_ps(x1_in_range, y_in_range));
                v2_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v2_offset_f[i], _mm256_and_ps(x2_in_range, y_in_range));
                v3_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v3_offset_f[i], _mm256_and_ps(x3_in_range, y_in_range));

                v0_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v0_offset_f[i]));
                v1_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v1_offset_f[i]));
                v2_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v2_offset_f[i]));
                v3_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v3_offset_f[i]));
            }

            transpose8x18_ps(tx, ty, v0_offset_f[0], v1_offset_f[0], v2_offset_f[0], v3_offset_f[0], v0_offset_f[1], v1_offset_f[1], v2_offset_f[1], v3_offset_f[1], v0_offset_f[2], v1_offset_f[2], v2_offset_f[2], v3_offset_f[2], v0_offset_f[3], v1_offset_f[3], v2_offset_f[3], v3_offset_f[3]);

            _mm256_storeu_ps(offset_value_ptr, tx);
            _mm256_storeu_ps(offset_value_ptr + 8, ty);
            offset_value_ptr += 16;
            for (int i = 0; i < 4; i++)
            {
                _mm256_storeu_ps(offset_value_ptr, v0_offset_f[i]);
                _mm256_storeu_ps(offset_value_ptr + 8, v1_offset_f[i]);
                _mm256_storeu_ps(offset_value_ptr + 16, v2_offset_f[i]);
                _mm256_storeu_ps(offset_value_ptr + 24, v3_offset_f[i]);
                offset_value_ptr += 32;
            }

            gridptr_x += 8;
            gridptr_y += 8;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;

            sample_x = unormalize(src.w, sample_x);
            sample_y = unormalize(src.h, sample_y);

            int x1 = floorf(sample_x);
            int y1 = floorf(sample_y);
            int x0 = x1 - 1;
            int x2 = x1 + 1;
            int x3 = x1 + 2;

            offset_value_ptr[0] = sample_x - static_cast<float>(x1);
            offset_value_ptr[1] = sample_y - static_cast<float>(y1);

            x1 = get_coord(src.w, x1);
            x0 = get_coord(src.w, x0);
            x2 = get_coord(src.w, x2);
            x3 = get_coord(src.w, x3);

            bool x1_in_range = (x1 > -1) & (x1 < src.w);
            bool x0_in_range = (x0 > -1) & (x0 < src.w);
            bool x2_in_range = (x2 > -1) & (x2 < src.w);
            bool x3_in_range = (x3 > -1) & (x3 < src.w);

            int* offset_ptr = (int*)offset_value_ptr + 2;

            for (int i = 0; i < 4; i++)
            {
                int gy = y1 + i - 1;
                gy = get_coord(src.h, gy);
                int offset_y = gy * src.w;

                bool y_in_range = (gy > -1) & (gy < src.h);

                bool v0_in_bound = (x0_in_range & y_in_range);
                bool v1_in_bound = (x1_in_range & y_in_range);
                bool v2_in_bound = (x2_in_range & y_in_range);
                bool v3_in_bound = (x3_in_range & y_in_range);

                offset_ptr[0] = v0_in_bound ? (offset_y + x0) * src.elempack : -1.0;
                offset_ptr[1] = v1_in_bound ? (offset_y + x1) * src.elempack : -1.0;
                offset_ptr[2] = v2_in_bound ? (offset_y + x2) * src.elempack : -1.0;
                offset_ptr[3] = v3_in_bound ? (offset_y + x3) * src.elempack : -1.0;

                offset_ptr += 4;
            }

            gridptr_x++;
            gridptr_y++;

            offset_value_ptr += 18;
        }
    }
}